

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

bool __thiscall
HighsHashTree<int,_void>::InnerLeaf<3>::find_key
          (InnerLeaf<3> *this,int *key,uint16_t *hash,int *pos)

{
  ushort uVar1;
  long lVar2;
  
  uVar1 = *hash;
  lVar2 = (long)*pos;
  while (((int)lVar2 != this->size && ((this->hashes)._M_elems[lVar2] == (ulong)uVar1))) {
    if (*key == (this->entries)._M_elems[lVar2].value_) {
      return true;
    }
    lVar2 = lVar2 + 1;
    *pos = (int)lVar2;
  }
  return false;
}

Assistant:

bool find_key(const K& key, const uint16_t& hash, int& pos) const {
      // find key
      while (pos != size && hashes[pos] == hash) {
        if (key == entries[pos].key()) return true;
        ++pos;
      }
      return false;
    }